

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool __thiscall
cmListCommand::InitialPass
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar1;
  int iVar2;
  string e;
  string local_38;
  
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__rhs) < 0x21) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"must be called with at least two arguments.","");
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
LAB_0022cc17:
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
LAB_0022cc24:
    bVar1 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar2 == 0) {
      bVar1 = HandleLengthCommand(this,args);
      return bVar1;
    }
    iVar2 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar2 == 0) {
      bVar1 = HandleGetCommand(this,args);
      return bVar1;
    }
    iVar2 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar2 == 0) {
      HandleAppendCommand(this,args);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        HandlePrependCommand(this,args);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar2 == 0) {
          HandlePopBackCommand(this,args);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              bVar1 = HandleFindCommand(this,args);
              return bVar1;
            }
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              bVar1 = HandleInsertCommand(this,args);
              return bVar1;
            }
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              bVar1 = HandleJoinCommand(this,args);
              return bVar1;
            }
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              bVar1 = HandleRemoveAtCommand(this,args);
              return bVar1;
            }
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              bVar1 = HandleRemoveItemCommand(this,args);
              return bVar1;
            }
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              bVar1 = HandleRemoveDuplicatesCommand(this,args);
              return bVar1;
            }
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              bVar1 = HandleTransformCommand(this,args);
              return bVar1;
            }
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              bVar1 = HandleSortCommand(this,args);
              return bVar1;
            }
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              bVar1 = HandleSublistCommand(this,args);
              return bVar1;
            }
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              bVar1 = HandleReverseCommand(this,args);
              return bVar1;
            }
            iVar2 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar2 == 0) {
              bVar1 = HandleFilterCommand(this,args);
              return bVar1;
            }
            std::operator+(&local_38,"does not recognize sub-command ",__rhs);
            cmCommand::SetError(&this->super_cmCommand,&local_38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_38._M_dataplus._M_p != &local_38.field_2) goto LAB_0022cc17;
            goto LAB_0022cc24;
          }
          HandlePopFrontCommand(this,args);
        }
      }
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmListCommand::InitialPass(std::vector<std::string> const& args,
                                cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("must be called with at least two arguments.");
    return false;
  }

  const std::string& subCommand = args[0];
  if (subCommand == "LENGTH") {
    return this->HandleLengthCommand(args);
  }
  if (subCommand == "GET") {
    return this->HandleGetCommand(args);
  }
  if (subCommand == "APPEND") {
    return this->HandleAppendCommand(args);
  }
  if (subCommand == "PREPEND") {
    return this->HandlePrependCommand(args);
  }
  if (subCommand == "POP_BACK") {
    return this->HandlePopBackCommand(args);
  }
  if (subCommand == "POP_FRONT") {
    return this->HandlePopFrontCommand(args);
  }
  if (subCommand == "FIND") {
    return this->HandleFindCommand(args);
  }
  if (subCommand == "INSERT") {
    return this->HandleInsertCommand(args);
  }
  if (subCommand == "JOIN") {
    return this->HandleJoinCommand(args);
  }
  if (subCommand == "REMOVE_AT") {
    return this->HandleRemoveAtCommand(args);
  }
  if (subCommand == "REMOVE_ITEM") {
    return this->HandleRemoveItemCommand(args);
  }
  if (subCommand == "REMOVE_DUPLICATES") {
    return this->HandleRemoveDuplicatesCommand(args);
  }
  if (subCommand == "TRANSFORM") {
    return this->HandleTransformCommand(args);
  }
  if (subCommand == "SORT") {
    return this->HandleSortCommand(args);
  }
  if (subCommand == "SUBLIST") {
    return this->HandleSublistCommand(args);
  }
  if (subCommand == "REVERSE") {
    return this->HandleReverseCommand(args);
  }
  if (subCommand == "FILTER") {
    return this->HandleFilterCommand(args);
  }

  std::string e = "does not recognize sub-command " + subCommand;
  this->SetError(e);
  return false;
}